

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O2

bool __thiscall
QDirListingPrivate::matchesFilters(QDirListingPrivate *this,QDirEntryInfo *entryInfo)

{
  QStringView fileName;
  bool bVar1;
  uint uVar2;
  storage_type_conflict *unaff_RBX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStackY_38;
  qsizetype qVar3;
  
  qVar3 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  QDirEntryInfo::fileName((QString *)&QStackY_38,entryInfo);
  if (QStackY_38.size != 0) {
    fileName.m_data = unaff_RBX;
    fileName.m_size = qVar3;
    bVar1 = isDotOrDotDot(fileName);
    if (bVar1) {
      bVar1 = (bool)((byte)(this->iteratorFlags).
                           super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                           super_QFlagsStorage<QDirListing::IteratorFlag>.i >> 7);
      goto LAB_0021a34c;
    }
    bVar1 = regexMatchesName(this,(QString *)&QStackY_38);
    if ((bVar1) &&
       ((((this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
          super_QFlagsStorage<QDirListing::IteratorFlag>.i & 0x40) != 0 ||
        (bVar1 = QDirEntryInfo::isHidden(entryInfo), !bVar1)))) {
      bVar1 = QDirEntryInfo::isSymLink(entryInfo);
      uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
              super_QFlagsStorage<QDirListing::IteratorFlag>.i;
      if (bVar1) {
        if ((uVar2 & 0x20) == 0) {
          if ((uVar2 & 0x1c) == 0) goto LAB_0021a2f3;
        }
        else {
          bVar1 = QDirEntryInfo::exists(entryInfo);
          if (bVar1) {
            uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                    super_QFlagsStorage<QDirListing::IteratorFlag>.i;
            goto LAB_0021a2f3;
          }
        }
      }
      else {
LAB_0021a2f3:
        if (((((uVar2 & 0x10) == 0) || (bVar1 = QDirEntryInfo::isFile(entryInfo), bVar1)) ||
            (bVar1 = QDirEntryInfo::isDir(entryInfo), bVar1)) ||
           (bVar1 = QDirEntryInfo::isSymLink(entryInfo), bVar1)) {
          uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                  super_QFlagsStorage<QDirListing::IteratorFlag>.i;
          if ((uVar2 & 8) != 0) {
            bVar1 = QDirEntryInfo::isDir(entryInfo);
            if (bVar1) goto LAB_0021a34a;
            uVar2 = (this->iteratorFlags).super_QFlagsStorageHelper<QDirListing::IteratorFlag,_4>.
                    super_QFlagsStorage<QDirListing::IteratorFlag>.i;
          }
          if (((uVar2 & 4) == 0) || (bVar1 = QDirEntryInfo::isFile(entryInfo), !bVar1)) {
            bVar1 = true;
            goto LAB_0021a34c;
          }
        }
      }
    }
  }
LAB_0021a34a:
  bVar1 = false;
LAB_0021a34c:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStackY_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != qVar3) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QDirListingPrivate::matchesFilters(QDirEntryInfo &entryInfo) const
{
    using F = QDirListing::IteratorFlag;

    const QString &fileName = entryInfo.fileName();
    if (fileName.isEmpty())
        return false;

    if (isDotOrDotDot(fileName)) // All done, other checks below don't matter in this case
        return iteratorFlags.testAnyFlags(F::IncludeDotAndDotDot);

    // name filter
#if QT_CONFIG(regularexpression)
    if (!regexMatchesName(fileName))
        return false;
#endif // QT_CONFIG(regularexpression)

    if (!iteratorFlags.testAnyFlag(F::IncludeHidden) && entryInfo.isHidden())
        return false;

    if (entryInfo.isSymLink()) {
        // With ResolveSymlinks, we look at the type of the link's target,
        // and exclude broken symlinks (where the target doesn't exist).
        if (iteratorFlags.testAnyFlag(F::ResolveSymlinks)) {
            if (!entryInfo.exists())
                return false;
        } else if (iteratorFlags.testAnyFlags(F::FilesOnly)
                   || iteratorFlags.testAnyFlags(F::DirsOnly)) {
            return false; // symlink is not a file or dir
        }
    }

    if (iteratorFlags.testAnyFlag(F::ExcludeOther)
        && !entryInfo.isFile() && !entryInfo.isDir() && !entryInfo.isSymLink()) {
        return false;
    }

    if (iteratorFlags.testAnyFlags(F::ExcludeDirs) && entryInfo.isDir())
        return false;

    if (iteratorFlags.testAnyFlags(F::ExcludeFiles) && entryInfo.isFile())
        return false;

    return true;
}